

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfers.c
# Opt level: O0

int equal_transfer(transfer_t *a,transfer_t *b)

{
  int iVar1;
  bool local_19;
  transfer_t *b_local;
  transfer_t *a_local;
  
  iVar1 = strcmp(a->from_stop_id,b->from_stop_id);
  local_19 = false;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->to_stop_id,b->to_stop_id);
    local_19 = false;
    if ((iVar1 == 0) && (local_19 = false, a->transfer_type == b->transfer_type)) {
      local_19 = a->min_transfer_time == b->min_transfer_time;
    }
  }
  return (int)local_19;
}

Assistant:

int equal_transfer(const transfer_t *a, const transfer_t *b) {
    return (!strcmp(a->from_stop_id, b->from_stop_id) &&
             !strcmp(a->to_stop_id, b->to_stop_id) &&
             a->transfer_type == b->transfer_type &&
             a->min_transfer_time == b->min_transfer_time);
}